

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

int lest::run(tests *specification,texts *arguments,ostream *os)

{
  options option_00;
  options option_01;
  count *this;
  action *this_00;
  ptags *this_01;
  times *this_02;
  confirm *this_03;
  tms *__buffer;
  int in_R8D;
  exception *e;
  vector<lest::test,_std::allocator<lest::test>_> local_310 [2];
  undefined1 local_2e0 [8];
  confirm confirm_;
  vector<lest::test,_std::allocator<lest::test>_> local_260 [2];
  undefined1 local_230 [8];
  times times_;
  vector<lest::test,_std::allocator<lest::test>_> local_1a8;
  undefined1 local_190 [8];
  ptags ptags_;
  vector<lest::test,_std::allocator<lest::test>_> local_140;
  undefined1 local_128 [8];
  print print_;
  vector<lest::test,_std::allocator<lest::test>_> local_108;
  undefined1 local_f0 [8];
  count count_;
  undefined1 local_c0 [40];
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  undefined1 local_68 [8];
  texts in;
  undefined1 auStack_40 [8];
  options option;
  ostream *os_local;
  texts *arguments_local;
  tests *specification_local;
  
  option.seed = (seed_t)os;
  options::options((options *)auStack_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_c0 + 0x10),arguments);
  split_arguments(&local_98,(texts *)(local_c0 + 0x10));
  std::tie<lest::options,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((options *)local_c0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)auStack_40);
  std::tuple<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
  ::operator=((tuple<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
               *)local_c0,&local_98);
  std::
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_c0 + 0x10));
  if ((option.help & 1U) != 0) {
    sort(specification);
  }
  if ((option.abort & 1U) != 0) {
    option_00.abort = auStack_40[1];
    option_00.help = auStack_40[0];
    option_00.count = auStack_40[2];
    option_00.list = auStack_40[3];
    option_00.tags = auStack_40[4];
    option_00.time = auStack_40[5];
    option_00.pass = (bool)auStack_40[6];
    option_00.zen = (bool)auStack_40[7];
    option_00.random = option.abort;
    option_00.lexical = option.help;
    option_00.verbose = option.count;
    option_00.version = option.list;
    option_00.repeat._0_1_ = option.tags;
    option_00.repeat._1_1_ = option.time;
    option_00.repeat._2_1_ = option.pass;
    option_00.repeat._3_1_ = option.zen;
    option_00.seed._0_1_ = option.lexical;
    option_00.seed._1_1_ = option.random;
    option_00.seed._2_1_ = option.verbose;
    option_00.seed._3_1_ = option.version;
    option_00.seed._4_4_ = option.repeat;
    shuffle(specification,option_00);
  }
  if ((auStack_40[0] & 1U) == 0) {
    if ((option.list & 1U) == 0) {
      if ((auStack_40[2] & 1U) == 0) {
        if ((auStack_40[3] & 1U) == 0) {
          if ((auStack_40[4] & 1U) == 0) {
            if ((auStack_40[5] & 1U) == 0) {
              local_310[1].super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)option._8_8_;
              option_01.abort = auStack_40[1];
              option_01.help = auStack_40[0];
              option_01.count = auStack_40[2];
              option_01.list = auStack_40[3];
              option_01.tags = auStack_40[4];
              option_01.time = auStack_40[5];
              option_01.pass = (bool)auStack_40[6];
              option_01.zen = (bool)auStack_40[7];
              option_01.random = option.abort;
              option_01.lexical = option.help;
              option_01.verbose = option.count;
              option_01.version = option.list;
              option_01.repeat._0_1_ = option.tags;
              option_01.repeat._1_1_ = option.time;
              option_01.repeat._2_1_ = option.pass;
              option_01.repeat._3_1_ = option.zen;
              option_01.seed._0_1_ = option.lexical;
              option_01.seed._1_1_ = option.random;
              option_01.seed._2_1_ = option.verbose;
              option_01.seed._3_1_ = option.version;
              option_01.seed._4_4_ = option.repeat;
              confirm::confirm((confirm *)local_2e0,(ostream *)option.seed,option_01);
              std::vector<lest::test,_std::allocator<lest::test>_>::vector(local_310,specification);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&e,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_68);
              this_03 = for_test<lest::confirm>
                                  ((lest *)local_310,(tests *)&e,(texts *)local_2e0,
                                   (confirm *)(ulong)(uint)option._4_4_,in_R8D);
              specification_local._4_4_ = confirm::operator_cast_to_int(this_03);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&e);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector(local_310);
              count_._12_4_ = 1;
              confirm::~confirm((confirm *)local_2e0);
            }
            else {
              local_260[1].super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)option._8_8_;
              times::times((times *)local_230,(tms *)option.seed);
              std::vector<lest::test,_std::allocator<lest::test>_>::vector(local_260,specification);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&confirm_.selected,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_68);
              __buffer = (tms *)&confirm_.selected;
              this_02 = for_test<lest::times>
                                  ((lest *)local_260,(tests *)__buffer,(texts *)local_230,
                                   (times *)0x1,in_R8D);
              specification_local._4_4_ = times::operator_cast_to_int(this_02);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&confirm_.selected);
              std::vector<lest::test,_std::allocator<lest::test>_>::~vector(local_260);
              count_._12_4_ = 1;
              times::~times((times *)local_230,__buffer);
            }
          }
          else {
            ptags::ptags((ptags *)local_190,(ostream *)option.seed);
            std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_1a8,specification);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&times_.total,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_68);
            this_01 = for_test<lest::ptags>
                                ((lest *)&local_1a8,(tests *)&times_.total,(texts *)local_190,
                                 (ptags *)0x1,in_R8D);
            specification_local._4_4_ = action::operator_cast_to_int(&this_01->super_action);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&times_.total);
            std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_1a8);
            count_._12_4_ = 1;
            ptags::~ptags((ptags *)local_190);
          }
        }
        else {
          print::print((print *)local_128,(ostream *)option.seed);
          std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_140,specification);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ptags_.result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
          this_00 = &for_test<lest::print>
                               ((lest *)&local_140,
                                (tests *)&ptags_.result._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(texts *)local_128,(print *)0x1,in_R8D)->
                     super_action;
          specification_local._4_4_ = action::operator_cast_to_int(this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ptags_.result._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_140);
          count_._12_4_ = 1;
        }
      }
      else {
        count::count((count *)local_f0,(ostream *)option.seed);
        std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_108,specification);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&print_,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68);
        this = for_test<lest::count>
                         ((lest *)&local_108,(tests *)&print_,(texts *)local_f0,(count *)0x1,in_R8D)
        ;
        specification_local._4_4_ = action::operator_cast_to_int(&this->super_action);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&print_);
        std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_108);
        count_._12_4_ = 1;
        count::~count((count *)local_f0);
      }
    }
    else {
      specification_local._4_4_ = version((ostream *)option.seed);
      count_._12_4_ = 1;
    }
  }
  else {
    specification_local._4_4_ = usage((ostream *)option.seed);
    count_._12_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  return specification_local._4_4_;
}

Assistant:

inline int run( tests specification, texts arguments, std::ostream & os = std::cout )
{
    try
    {
        options option; texts in;
        tie( option, in ) = split_arguments( arguments );

        if ( option.lexical ) {    sort( specification         ); }
        if ( option.random  ) { shuffle( specification, option ); }

        if ( option.help    ) { return usage  ( os ); }
        if ( option.version ) { return version( os ); }
        if ( option.count   ) { count count_( os         ); return for_test( specification, in, count_ ); }
        if ( option.list    ) { print print_( os         ); return for_test( specification, in, print_ ); }
        if ( option.tags    ) { ptags ptags_( os         ); return for_test( specification, in, ptags_ ); }
        if ( option.time    ) { times times_( os, option ); return for_test( specification, in, times_ ); }

        { confirm confirm_( os, option ); return for_test( specification, in, confirm_, option.repeat ); }
    }
    catch ( std::exception const & e )
    {
        os << "Error: " << e.what() << "\n";
        return 1;
    }
}